

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool duckdb::ForceGetTypeOperation::Operation
               (LogicalType *left,LogicalType *right,LogicalType *result)

{
  LogicalType LStack_28;
  
  LogicalType::ForceMaxLogicalType(&LStack_28,left,right);
  LogicalType::operator=(result,&LStack_28);
  LogicalType::~LogicalType(&LStack_28);
  return true;
}

Assistant:

static bool Operation(const LogicalType &left, const LogicalType &right, LogicalType &result) {
		result = LogicalType::ForceMaxLogicalType(left, right);
		return true;
	}